

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
::val(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
      *this)

{
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_> *pFVar1;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar5;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  pFVar4 = (this->right_->fadexpr_).left_;
  pFVar5 = (this->right_->fadexpr_).right_;
  return ((((pFVar2->fadexpr_).left_)->val_ - ((pFVar2->fadexpr_).right_)->val_) *
         (((pFVar3->fadexpr_).left_)->val_ + ((pFVar3->fadexpr_).right_)->val_) *
         ((pFVar1->fadexpr_).left_)->val_) /
         ((((pFVar5->fadexpr_).left_)->val_ + ((pFVar5->fadexpr_).right_)->val_) *
         (((pFVar4->fadexpr_).left_)->val_ + ((pFVar4->fadexpr_).right_)->val_));
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}